

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::ExpectAllFieldsSet<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  bool bVar1;
  char *pcVar2;
  TestAllTypes_OptionalGroup *pTVar3;
  TestAllTypes_NestedMessage *pTVar4;
  ForeignMessage *pFVar5;
  ImportMessage *pIVar6;
  PublicImportMessage *pPVar7;
  Cord *rhs;
  TestAllTypes_RepeatedGroup *pTVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar9;
  char *in_R9;
  AssertHelper local_23d0;
  Message local_23c8;
  string_view local_23c0;
  undefined1 local_23b0 [8];
  AssertionResult gtest_ar_111;
  AssertHelper local_2380;
  Message local_2378;
  bool local_2369;
  undefined1 local_2368 [8];
  AssertionResult gtest_ar__60;
  AssertHelper local_2338;
  Message local_2330;
  bool local_2321;
  undefined1 local_2320 [8];
  AssertionResult gtest_ar__59;
  AssertHelper local_22f0;
  Message local_22e8;
  bool local_22d9;
  undefined1 local_22d8 [8];
  AssertionResult gtest_ar__58;
  AssertHelper local_22a8;
  Message local_22a0;
  bool local_2291;
  undefined1 local_2290 [8];
  AssertionResult gtest_ar__57;
  Message local_2278;
  ImportEnum local_2270 [2];
  undefined1 local_2268 [8];
  AssertionResult gtest_ar_110;
  Message local_2250;
  ForeignEnum local_2248 [2];
  undefined1 local_2240 [8];
  AssertionResult gtest_ar_109;
  Message local_2228;
  TestAllTypes_NestedEnum local_221c;
  undefined1 local_2218 [8];
  AssertionResult gtest_ar_108;
  Message local_2200;
  string_view local_21f8;
  undefined1 local_21e8 [8];
  AssertionResult gtest_ar_107;
  Message local_21d0;
  string_view local_21c8;
  undefined1 local_21b8 [8];
  AssertionResult gtest_ar_106;
  AssertHelper local_2188;
  Message local_2180;
  bool local_2171;
  undefined1 local_2170 [8];
  AssertionResult gtest_ar__56;
  Message local_2158;
  double local_2150;
  int local_2144;
  undefined1 local_2140 [8];
  AssertionResult gtest_ar_105;
  Message local_2128;
  float local_2120;
  int local_211c;
  undefined1 local_2118 [8];
  AssertionResult gtest_ar_104;
  Message local_2100;
  int64_t local_20f8;
  int local_20ec;
  undefined1 local_20e8 [8];
  AssertionResult gtest_ar_103;
  Message local_20d0;
  int32_t local_20c8;
  int local_20c4;
  undefined1 local_20c0 [8];
  AssertionResult gtest_ar_102;
  Message local_20a8;
  uint64_t local_20a0;
  int local_2094;
  undefined1 local_2090 [8];
  AssertionResult gtest_ar_101;
  Message local_2078;
  uint32_t local_2070 [2];
  undefined1 local_2068 [8];
  AssertionResult gtest_ar_100;
  Message local_2050;
  int64_t local_2048;
  int local_203c;
  undefined1 local_2038 [8];
  AssertionResult gtest_ar_99;
  Message local_2020;
  int32_t local_2018;
  int local_2014;
  undefined1 local_2010 [8];
  AssertionResult gtest_ar_98;
  Message local_1ff8;
  uint64_t local_1ff0;
  int local_1fe4;
  undefined1 local_1fe0 [8];
  AssertionResult gtest_ar_97;
  Message local_1fc8;
  uint32_t local_1fc0 [2];
  undefined1 local_1fb8 [8];
  AssertionResult gtest_ar_96;
  Message local_1fa0;
  int64_t local_1f98;
  int local_1f8c;
  undefined1 local_1f88 [8];
  AssertionResult gtest_ar_95;
  Message local_1f70;
  int32_t local_1f68;
  int local_1f64;
  undefined1 local_1f60 [8];
  AssertionResult gtest_ar_94;
  AssertHelper local_1f30;
  Message local_1f28;
  bool local_1f19;
  undefined1 local_1f18 [8];
  AssertionResult gtest_ar__55;
  AssertHelper local_1ee8;
  Message local_1ee0;
  bool local_1ed1;
  undefined1 local_1ed0 [8];
  AssertionResult gtest_ar__54;
  AssertHelper local_1ea0;
  Message local_1e98;
  bool local_1e89;
  undefined1 local_1e88 [8];
  AssertionResult gtest_ar__53;
  AssertHelper local_1e58;
  Message local_1e50;
  bool local_1e41;
  undefined1 local_1e40 [8];
  AssertionResult gtest_ar__52;
  AssertHelper local_1e10;
  Message local_1e08;
  bool local_1df9;
  undefined1 local_1df8 [8];
  AssertionResult gtest_ar__51;
  AssertHelper local_1dc8;
  Message local_1dc0;
  bool local_1db1;
  undefined1 local_1db0 [8];
  AssertionResult gtest_ar__50;
  AssertHelper local_1d80;
  Message local_1d78;
  bool local_1d69;
  undefined1 local_1d68 [8];
  AssertionResult gtest_ar__49;
  AssertHelper local_1d38;
  Message local_1d30;
  bool local_1d21;
  undefined1 local_1d20 [8];
  AssertionResult gtest_ar__48;
  AssertHelper local_1cf0;
  Message local_1ce8;
  bool local_1cd9;
  undefined1 local_1cd8 [8];
  AssertionResult gtest_ar__47;
  AssertHelper local_1ca8;
  Message local_1ca0;
  bool local_1c91;
  undefined1 local_1c90 [8];
  AssertionResult gtest_ar__46;
  AssertHelper local_1c60;
  Message local_1c58;
  bool local_1c49;
  undefined1 local_1c48 [8];
  AssertionResult gtest_ar__45;
  AssertHelper local_1c18;
  Message local_1c10;
  bool local_1c01;
  undefined1 local_1c00 [8];
  AssertionResult gtest_ar__44;
  AssertHelper local_1bd0;
  Message local_1bc8;
  bool local_1bb9;
  undefined1 local_1bb8 [8];
  AssertionResult gtest_ar__43;
  AssertHelper local_1b88;
  Message local_1b80;
  bool local_1b71;
  undefined1 local_1b70 [8];
  AssertionResult gtest_ar__42;
  AssertHelper local_1b40;
  Message local_1b38;
  bool local_1b29;
  undefined1 local_1b28 [8];
  AssertionResult gtest_ar__41;
  AssertHelper local_1af8;
  Message local_1af0;
  bool local_1ae1;
  undefined1 local_1ae0 [8];
  AssertionResult gtest_ar__40;
  AssertHelper local_1ab0;
  Message local_1aa8;
  bool local_1a99;
  undefined1 local_1a98 [8];
  AssertionResult gtest_ar__39;
  AssertHelper local_1a68;
  Message local_1a60;
  bool local_1a51;
  undefined1 local_1a50 [8];
  AssertionResult gtest_ar__38;
  Message local_1a38;
  ImportEnum local_1a30 [2];
  undefined1 local_1a28 [8];
  AssertionResult gtest_ar_93;
  Message local_1a10;
  ForeignEnum local_1a08 [2];
  undefined1 local_1a00 [8];
  AssertionResult gtest_ar_92;
  Message local_19e8;
  TestAllTypes_NestedEnum local_19dc;
  undefined1 local_19d8 [8];
  AssertionResult gtest_ar_91;
  Message local_19c0;
  int32_t local_19b8;
  int local_19b4;
  undefined1 local_19b0 [8];
  AssertionResult gtest_ar_90;
  Message local_1998;
  int32_t local_1990;
  int local_198c;
  undefined1 local_1988 [8];
  AssertionResult gtest_ar_89;
  Message local_1970;
  int local_1968 [2];
  undefined1 local_1960 [8];
  AssertionResult gtest_ar_88;
  Message local_1948;
  int32_t local_1940;
  int local_193c;
  undefined1 local_1938 [8];
  AssertionResult gtest_ar_87;
  Message local_1920;
  int32_t local_1918;
  int local_1914;
  undefined1 local_1910 [8];
  AssertionResult gtest_ar_86;
  Message local_18f8;
  string_view local_18f0;
  undefined1 local_18e0 [8];
  AssertionResult gtest_ar_85;
  Message local_18c8;
  string_view local_18c0;
  undefined1 local_18b0 [8];
  AssertionResult gtest_ar_84;
  AssertHelper local_1880;
  Message local_1878;
  bool local_1869;
  undefined1 local_1868 [8];
  AssertionResult gtest_ar__37;
  Message local_1850;
  double local_1848;
  int local_183c;
  undefined1 local_1838 [8];
  AssertionResult gtest_ar_83;
  Message local_1820;
  float local_1818;
  int local_1814;
  undefined1 local_1810 [8];
  AssertionResult gtest_ar_82;
  Message local_17f8;
  int64_t local_17f0;
  int local_17e4;
  undefined1 local_17e0 [8];
  AssertionResult gtest_ar_81;
  Message local_17c8;
  int32_t local_17c0;
  int local_17bc;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar_80;
  Message local_17a0;
  uint64_t local_1798;
  int local_178c;
  undefined1 local_1788 [8];
  AssertionResult gtest_ar_79;
  Message local_1770;
  uint32_t local_1768 [2];
  undefined1 local_1760 [8];
  AssertionResult gtest_ar_78;
  Message local_1748;
  int64_t local_1740;
  int local_1734;
  undefined1 local_1730 [8];
  AssertionResult gtest_ar_77;
  Message local_1718;
  int32_t local_1710;
  int local_170c;
  undefined1 local_1708 [8];
  AssertionResult gtest_ar_76;
  Message local_16f0;
  uint64_t local_16e8;
  int local_16dc;
  undefined1 local_16d8 [8];
  AssertionResult gtest_ar_75;
  Message local_16c0;
  uint32_t local_16b8 [2];
  undefined1 local_16b0 [8];
  AssertionResult gtest_ar_74;
  Message local_1698;
  int64_t local_1690;
  int local_1684;
  undefined1 local_1680 [8];
  AssertionResult gtest_ar_73;
  Message local_1668;
  int32_t local_1660;
  int local_165c;
  undefined1 local_1658 [8];
  AssertionResult gtest_ar_72;
  Message local_1640;
  ImportEnum local_1638 [2];
  undefined1 local_1630 [8];
  AssertionResult gtest_ar_71;
  Message local_1618;
  ForeignEnum local_1610 [2];
  undefined1 local_1608 [8];
  AssertionResult gtest_ar_70;
  Message local_15f0;
  TestAllTypes_NestedEnum local_15e4;
  undefined1 local_15e0 [8];
  AssertionResult gtest_ar_69;
  Message local_15c8;
  int32_t local_15c0;
  int local_15bc;
  undefined1 local_15b8 [8];
  AssertionResult gtest_ar_68;
  Message local_15a0;
  int32_t local_1598;
  int local_1594;
  undefined1 local_1590 [8];
  AssertionResult gtest_ar_67;
  Message local_1578;
  int local_1570 [2];
  undefined1 local_1568 [8];
  AssertionResult gtest_ar_66;
  Message local_1550;
  int32_t local_1548;
  int local_1544;
  undefined1 local_1540 [8];
  AssertionResult gtest_ar_65;
  Message local_1528;
  int32_t local_1520;
  int local_151c;
  undefined1 local_1518 [8];
  AssertionResult gtest_ar_64;
  Message local_1500;
  string_view local_14f8;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_63;
  Message local_14d0;
  string_view local_14c8;
  undefined1 local_14b8 [8];
  AssertionResult gtest_ar_62;
  AssertHelper local_1488;
  Message local_1480;
  bool local_1471;
  undefined1 local_1470 [8];
  AssertionResult gtest_ar__36;
  Message local_1458;
  double local_1450;
  int local_1444;
  undefined1 local_1440 [8];
  AssertionResult gtest_ar_61;
  Message local_1428;
  float local_1420;
  int local_141c;
  undefined1 local_1418 [8];
  AssertionResult gtest_ar_60;
  Message local_1400;
  int64_t local_13f8;
  int local_13ec;
  undefined1 local_13e8 [8];
  AssertionResult gtest_ar_59;
  Message local_13d0;
  int32_t local_13c8;
  int local_13c4;
  undefined1 local_13c0 [8];
  AssertionResult gtest_ar_58;
  Message local_13a8;
  uint64_t local_13a0;
  int local_1394;
  undefined1 local_1390 [8];
  AssertionResult gtest_ar_57;
  Message local_1378;
  uint32_t local_1370 [2];
  undefined1 local_1368 [8];
  AssertionResult gtest_ar_56;
  Message local_1350;
  int64_t local_1348;
  int local_133c;
  undefined1 local_1338 [8];
  AssertionResult gtest_ar_55;
  Message local_1320;
  int32_t local_1318;
  int local_1314;
  undefined1 local_1310 [8];
  AssertionResult gtest_ar_54;
  Message local_12f8;
  uint64_t local_12f0;
  int local_12e4;
  undefined1 local_12e0 [8];
  AssertionResult gtest_ar_53;
  Message local_12c8;
  uint32_t local_12c0 [2];
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar_52;
  Message local_12a0;
  int64_t local_1298;
  int local_128c;
  undefined1 local_1288 [8];
  AssertionResult gtest_ar_51;
  Message local_1270;
  int32_t local_1268;
  int local_1264;
  undefined1 local_1260 [8];
  AssertionResult gtest_ar_50;
  Message local_1248;
  int local_1240 [2];
  undefined1 local_1238 [8];
  AssertionResult gtest_ar_49;
  Message local_1220;
  int local_1218 [2];
  undefined1 local_1210 [8];
  AssertionResult gtest_ar_48;
  Message local_11f8;
  int local_11f0 [2];
  undefined1 local_11e8 [8];
  AssertionResult gtest_ar_47;
  Message local_11d0;
  int local_11c8 [2];
  undefined1 local_11c0 [8];
  AssertionResult gtest_ar_46;
  Message local_11a8;
  int local_11a0 [2];
  undefined1 local_1198 [8];
  AssertionResult gtest_ar_45;
  Message local_1180;
  int local_1178 [2];
  undefined1 local_1170 [8];
  AssertionResult gtest_ar_44;
  Message local_1158;
  int local_1150 [2];
  undefined1 local_1148 [8];
  AssertionResult gtest_ar_43;
  Message local_1130;
  int local_1128 [2];
  undefined1 local_1120 [8];
  AssertionResult gtest_ar_42;
  Message local_1108;
  int local_1100 [2];
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar_41;
  Message local_10e0;
  int local_10d8 [2];
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar_40;
  Message local_10b8;
  int local_10b0 [2];
  undefined1 local_10a8 [8];
  AssertionResult gtest_ar_39;
  Message local_1090;
  int local_1088 [2];
  undefined1 local_1080 [8];
  AssertionResult gtest_ar_38;
  Message local_1068;
  int local_1060 [2];
  undefined1 local_1058 [8];
  AssertionResult gtest_ar_37;
  Message local_1040;
  int local_1038 [2];
  undefined1 local_1030 [8];
  AssertionResult gtest_ar_36;
  Message local_1018;
  int local_1010 [2];
  undefined1 local_1008 [8];
  AssertionResult gtest_ar_35;
  Message local_ff0;
  int local_fe8 [2];
  undefined1 local_fe0 [8];
  AssertionResult gtest_ar_34;
  Message local_fc8;
  int local_fc0 [2];
  undefined1 local_fb8 [8];
  AssertionResult gtest_ar_33;
  Message local_fa0;
  int local_f98 [2];
  undefined1 local_f90 [8];
  AssertionResult gtest_ar_32;
  Message local_f78;
  int local_f70 [2];
  undefined1 local_f68 [8];
  AssertionResult gtest_ar_31;
  Message local_f50;
  int local_f48 [2];
  undefined1 local_f40 [8];
  AssertionResult gtest_ar_30;
  Message local_f28;
  int local_f20 [2];
  undefined1 local_f18 [8];
  AssertionResult gtest_ar_29;
  Message local_f00;
  int local_ef8 [2];
  undefined1 local_ef0 [8];
  AssertionResult gtest_ar_28;
  Message local_ed8;
  int local_ed0 [2];
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_27;
  Message local_eb0;
  int local_ea8 [2];
  undefined1 local_ea0 [8];
  AssertionResult gtest_ar_26;
  AssertHelper local_e88;
  Message local_e80;
  int local_e78 [2];
  undefined1 local_e70 [8];
  AssertionResult gtest_ar_25;
  Message local_e58;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_24;
  Message local_e38;
  ImportEnum local_e30 [2];
  undefined1 local_e28 [8];
  AssertionResult gtest_ar_23;
  Message local_e10;
  ForeignEnum local_e08 [2];
  undefined1 local_e00 [8];
  AssertionResult gtest_ar_22;
  Message local_de8;
  TestAllTypes_NestedEnum local_ddc;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar_21;
  Message local_dc0;
  int32_t local_db8;
  int local_db4;
  undefined1 local_db0 [8];
  AssertionResult gtest_ar_20;
  Message local_d98;
  int32_t local_d90;
  int local_d8c;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar_19;
  Message local_d70;
  int32_t local_d68;
  int local_d64;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar_18;
  Message local_d48;
  int32_t local_d40;
  int local_d3c;
  undefined1 local_d38 [8];
  AssertionResult gtest_ar_17;
  Message local_d20;
  int local_d18 [2];
  undefined1 local_d10 [8];
  AssertionResult gtest_ar_16;
  Message local_cf8;
  int32_t local_cf0;
  int local_cec;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar_15;
  Message local_cd0;
  int32_t local_cc8;
  int local_cc4;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_14;
  Message local_ca8;
  string_view local_ca0;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar_13;
  Message local_c78;
  string_view local_c70;
  undefined1 local_c60 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_c30;
  Message local_c28;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__35;
  Message local_c00;
  double local_bf8;
  int local_bec;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar_11;
  Message local_bd0;
  float local_bc8;
  int local_bc4;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_10;
  Message local_ba8;
  int64_t local_ba0;
  int local_b94;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_9;
  Message local_b78;
  int32_t local_b70;
  int local_b6c;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar_8;
  Message local_b50;
  uint64_t local_b48;
  int local_b3c;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar_7;
  Message local_b20;
  uint32_t local_b18 [2];
  undefined1 local_b10 [8];
  AssertionResult gtest_ar_6;
  Message local_af8;
  int64_t local_af0;
  int local_ae4;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar_5;
  Message local_ac8;
  int32_t local_ac0;
  int local_abc;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_4;
  Message local_aa0;
  uint64_t local_a98;
  int local_a8c;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_3;
  Message local_a70;
  uint32_t local_a68 [2];
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_2;
  Message local_a48;
  int64_t local_a40;
  int local_a34;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_1;
  Message local_a18;
  int32_t local_a10;
  int local_a0c;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar;
  AssertHelper local_9d8;
  Message local_9d0;
  bool local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_990;
  Message local_988;
  bool local_979;
  undefined1 local_978 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_948;
  Message local_940;
  bool local_931;
  undefined1 local_930 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_900;
  Message local_8f8;
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_828;
  Message local_820;
  bool local_811;
  undefined1 local_810 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_7e0;
  Message local_7d8;
  bool local_7c9;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_798;
  Message local_790;
  bool local_781;
  undefined1 local_780 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_750;
  Message local_748;
  bool local_739;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_708;
  Message local_700;
  bool local_6f1;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_6c0;
  Message local_6b8;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_678;
  Message local_670;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_630;
  Message local_628;
  bool local_619;
  undefined1 local_618 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_5e8;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_5a0;
  Message local_598;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_558;
  Message local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_510;
  Message local_508;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_4c8;
  Message local_4c0;
  bool local_4b1;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_480;
  Message local_478;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_438;
  Message local_430;
  bool local_421;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_3f0;
  Message local_3e8;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48 [3];
  Message local_30;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  TestAllTypes *message_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )message;
  local_21 = edition_unittest::TestAllTypes::has_optional_int32(message);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"message.has_optional_int32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x700,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_79 = edition_unittest::TestAllTypes::has_optional_int64
                       ((TestAllTypes *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_78,
               (AssertionResult *)"message.has_optional_int64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x701,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_c1 = edition_unittest::TestAllTypes::has_optional_uint32
                       ((TestAllTypes *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c0,
               (AssertionResult *)"message.has_optional_uint32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x702,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_109 = edition_unittest::TestAllTypes::has_optional_uint64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_108,
               (AssertionResult *)"message.has_optional_uint64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x703,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_151 = edition_unittest::TestAllTypes::has_optional_sint32
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_150,
               (AssertionResult *)"message.has_optional_sint32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x704,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_199 = edition_unittest::TestAllTypes::has_optional_sint64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_198,
               (AssertionResult *)"message.has_optional_sint64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x705,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1e1 = edition_unittest::TestAllTypes::has_optional_fixed32
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1e0,
               (AssertionResult *)"message.has_optional_fixed32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x706,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_229 = edition_unittest::TestAllTypes::has_optional_fixed64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_228,
               (AssertionResult *)"message.has_optional_fixed64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x707,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_271 = edition_unittest::TestAllTypes::has_optional_sfixed32
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_270,
               (AssertionResult *)"message.has_optional_sfixed32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x708,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2b9 = edition_unittest::TestAllTypes::has_optional_sfixed64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_2b8,
               (AssertionResult *)"message.has_optional_sfixed64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x709,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_301 = edition_unittest::TestAllTypes::has_optional_float
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_300,
               (AssertionResult *)"message.has_optional_float()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_349 = edition_unittest::TestAllTypes::has_optional_double
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_348,
               (AssertionResult *)"message.has_optional_double()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_391 = edition_unittest::TestAllTypes::has_optional_bool
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_390,
               (AssertionResult *)"message.has_optional_bool()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3d9 = edition_unittest::TestAllTypes::has_optional_string
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_3d8,
               (AssertionResult *)"message.has_optional_string()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_421 = edition_unittest::TestAllTypes::has_optional_bytes
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_420,&local_421,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_420,
               (AssertionResult *)"message.has_optional_bytes()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_469 = edition_unittest::TestAllTypes::has_optionalgroup
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_468,
               (AssertionResult *)"message.has_optionalgroup()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x710,pcVar2);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_4b1 = edition_unittest::TestAllTypes::has_optional_nested_message
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b0,&local_4b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_4b0,
               (AssertionResult *)"message.has_optional_nested_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x711,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4f9 = edition_unittest::TestAllTypes::has_optional_foreign_message
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_4f8,
               (AssertionResult *)"message.has_optional_foreign_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x712,pcVar2);
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_541 = edition_unittest::TestAllTypes::has_optional_import_message
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_540,&local_541,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_540,
               (AssertionResult *)"message.has_optional_import_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x713,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_589 = edition_unittest::TestAllTypes::has_optional_public_import_message
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_588,&local_589,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_588,
               (AssertionResult *)"message.has_optional_public_import_message()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x714,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  local_5d1 = edition_unittest::TestAllTypes::has_optional_lazy_message
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_5d0,
               (AssertionResult *)"message.has_optional_lazy_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x715,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_619 = edition_unittest::TestAllTypes::has_optional_unverified_lazy_message
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_618,&local_619,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_618,
               (AssertionResult *)"message.has_optional_unverified_lazy_message()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x716,pcVar2);
    testing::internal::AssertHelper::operator=(&local_630,&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  pTVar3 = edition_unittest::TestAllTypes::optionalgroup
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_661 = edition_unittest::TestAllTypes_OptionalGroup::has_a(pTVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_660,&local_661,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_660,
               (AssertionResult *)"message.optionalgroup().has_a()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x718,pcVar2);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  pTVar4 = edition_unittest::TestAllTypes::optional_nested_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_6a9 = edition_unittest::TestAllTypes_NestedMessage::has_bb(pTVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_6a8,
               (AssertionResult *)"message.optional_nested_message().has_bb()","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x719,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  pFVar5 = edition_unittest::TestAllTypes::optional_foreign_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_6f1 = edition_unittest::ForeignMessage::has_c(pFVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f0,&local_6f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_6f0,
               (AssertionResult *)"message.optional_foreign_message().has_c()","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  pIVar6 = edition_unittest::TestAllTypes::optional_import_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_739 = proto2_unittest_import::ImportMessage::has_d(pIVar6);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_738,&local_739,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_738,
               (AssertionResult *)"message.optional_import_message().has_d()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  pPVar7 = edition_unittest::TestAllTypes::optional_public_import_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_781 = proto2_unittest_import::PublicImportMessage::has_e(pPVar7);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_780,&local_781,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_780,
               (AssertionResult *)"message.optional_public_import_message().has_e()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_798,&local_790);
    testing::internal::AssertHelper::~AssertHelper(&local_798);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  pTVar4 = edition_unittest::TestAllTypes::optional_lazy_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_7c9 = edition_unittest::TestAllTypes_NestedMessage::has_bb(pTVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c8,&local_7c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_7c8,
               (AssertionResult *)"message.optional_lazy_message().has_bb()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  pTVar4 = edition_unittest::TestAllTypes::optional_unverified_lazy_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_811 = edition_unittest::TestAllTypes_NestedMessage::has_bb(pTVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_810,&local_811,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_810,
               (AssertionResult *)"message.optional_unverified_lazy_message().has_bb()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  local_859 = edition_unittest::TestAllTypes::has_optional_nested_enum
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_858,
               (AssertionResult *)"message.has_optional_nested_enum()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x720,pcVar2);
    testing::internal::AssertHelper::operator=(&local_870,&local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  local_8a1 = edition_unittest::TestAllTypes::has_optional_foreign_enum
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_8a0,
               (AssertionResult *)"message.has_optional_foreign_enum()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x721,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  local_8e9 = edition_unittest::TestAllTypes::has_optional_import_enum
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_8e8,
               (AssertionResult *)"message.has_optional_import_enum()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x722,pcVar2);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  local_931 = edition_unittest::TestAllTypes::has_optional_string_piece
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_930,&local_931,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_930,
               (AssertionResult *)"message.has_optional_string_piece()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x725,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  local_979 = edition_unittest::TestAllTypes::has_optional_cord
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_978,&local_979,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_978,
               (AssertionResult *)"message.has_optional_cord()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x726,pcVar2);
    testing::internal::AssertHelper::operator=(&local_990,&local_988);
    testing::internal::AssertHelper::~AssertHelper(&local_990);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  local_9c1 = edition_unittest::TestAllTypes::has_optional_bytes_cord
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c0,&local_9c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_9c0,
               (AssertionResult *)"message.has_optional_bytes_cord()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x728,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9d8,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  local_a0c = 0x65;
  local_a10 = edition_unittest::TestAllTypes::optional_int32
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a08,"101","message.optional_int32()",&local_a0c,&local_a10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  local_a34 = 0x66;
  local_a40 = edition_unittest::TestAllTypes::optional_int64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_a30,"102","message.optional_int64()",&local_a34,&local_a40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
  if (!bVar1) {
    testing::Message::Message(&local_a48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
  local_a68[1] = 0x67;
  local_a68[0] = edition_unittest::TestAllTypes::optional_uint32
                           ((TestAllTypes *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_a60,"103","message.optional_uint32()",(int *)(local_a68 + 1),
             local_a68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(&local_a70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  local_a8c = 0x68;
  local_a98 = edition_unittest::TestAllTypes::optional_uint64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a88,"104","message.optional_uint64()",&local_a8c,&local_a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  local_abc = 0x69;
  local_ac0 = edition_unittest::TestAllTypes::optional_sint32
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ab8,"105","message.optional_sint32()",&local_abc,&local_ac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_ac8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_ac8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  local_ae4 = 0x6a;
  local_af0 = edition_unittest::TestAllTypes::optional_sint64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_ae0,"106","message.optional_sint64()",&local_ae4,&local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
  if (!bVar1) {
    testing::Message::Message(&local_af8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_af8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
  local_b18[1] = 0x6b;
  local_b18[0] = edition_unittest::TestAllTypes::optional_fixed32
                           ((TestAllTypes *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_b10,"107","message.optional_fixed32()",(int *)(local_b18 + 1),
             local_b18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b10);
  if (!bVar1) {
    testing::Message::Message(&local_b20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x730,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_b20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_b20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
  local_b3c = 0x6c;
  local_b48 = edition_unittest::TestAllTypes::optional_fixed64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_b38,"108","message.optional_fixed64()",&local_b3c,&local_b48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar1) {
    testing::Message::Message(&local_b50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x731,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_b50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  local_b6c = 0x6d;
  local_b70 = edition_unittest::TestAllTypes::optional_sfixed32
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b68,"109","message.optional_sfixed32()",&local_b6c,&local_b70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
  if (!bVar1) {
    testing::Message::Message(&local_b78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x732,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
  local_b94 = 0x6e;
  local_ba0 = edition_unittest::TestAllTypes::optional_sfixed64
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_b90,"110","message.optional_sfixed64()",&local_b94,&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x733,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  local_bc4 = 0x6f;
  local_bc8 = edition_unittest::TestAllTypes::optional_float
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_float,_nullptr>
            ((EqHelper *)local_bc0,"111","message.optional_float()",&local_bc4,&local_bc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x734,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  local_bec = 0x70;
  local_bf8 = edition_unittest::TestAllTypes::optional_double
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((EqHelper *)local_be8,"112","message.optional_double()",&local_bec,&local_bf8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x735,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__35.message_,&local_c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__35.message_);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  local_c19 = edition_unittest::TestAllTypes::optional_bool
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c18,&local_c19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_c18,
               (AssertionResult *)"message.optional_bool()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x736,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c30,&local_c28);
    testing::internal::AssertHelper::~AssertHelper(&local_c30);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_c28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  local_c70 = edition_unittest::TestAllTypes::optional_string
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_c60,"\"115\"","message.optional_string()",(char (*) [4])"115",
             &local_c70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c60);
  if (!bVar1) {
    testing::Message::Message(&local_c78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x737,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_c78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_c78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c60);
  local_ca0 = edition_unittest::TestAllTypes::optional_bytes
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_c90,"\"116\"","message.optional_bytes()",(char (*) [4])"116",
             &local_ca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
  if (!bVar1) {
    testing::Message::Message(&local_ca8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x738,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
  local_cc4 = 0x75;
  pTVar3 = edition_unittest::TestAllTypes::optionalgroup
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_cc8 = edition_unittest::TestAllTypes_OptionalGroup::a(pTVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_cc0,"117","message.optionalgroup().a()",&local_cc4,&local_cc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar1) {
    testing::Message::Message(&local_cd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  local_cec = 0x76;
  pTVar4 = edition_unittest::TestAllTypes::optional_nested_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_cf0 = edition_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
  pcVar2 = "118";
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ce8,"118","message.optional_nested_message().bb()",&local_cec,
             &local_cf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar1) {
    testing::Message::Message(&local_cf8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ce8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73b,pcVar2);
    pcVar2 = (char *)&local_cf8;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_16.message_,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  local_d18[1] = 0x77;
  pFVar5 = edition_unittest::TestAllTypes::optional_foreign_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_d18[0] = edition_unittest::ForeignMessage::c(pFVar5,pcVar2,extraout_RDX);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d10,"119","message.optional_foreign_message().c()",local_d18 + 1,
             local_d18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar1) {
    testing::Message::Message(&local_d20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  local_d3c = 0x78;
  pIVar6 = edition_unittest::TestAllTypes::optional_import_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_d40 = proto2_unittest_import::ImportMessage::d(pIVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d38,"120","message.optional_import_message().d()",&local_d3c,
             &local_d40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d38);
  if (!bVar1) {
    testing::Message::Message(&local_d48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_d48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_d48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d38);
  local_d64 = 0x7e;
  pPVar7 = edition_unittest::TestAllTypes::optional_public_import_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_d68 = proto2_unittest_import::PublicImportMessage::e(pPVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d60,"126","message.optional_public_import_message().e()",&local_d64,
             &local_d68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
  if (!bVar1) {
    testing::Message::Message(&local_d70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_d70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_d70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
  local_d8c = 0x7f;
  pTVar4 = edition_unittest::TestAllTypes::optional_lazy_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_d90 = edition_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d88,"127","message.optional_lazy_message().bb()",&local_d8c,
             &local_d90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
  if (!bVar1) {
    testing::Message::Message(&local_d98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_d98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
  local_db4 = 0x80;
  pTVar4 = edition_unittest::TestAllTypes::optional_unverified_lazy_message
                     ((TestAllTypes *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_db8 = edition_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_db0,"128","message.optional_unverified_lazy_message().bb()",
             &local_db4,&local_db8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0);
  if (!bVar1) {
    testing::Message::Message(&local_dc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_db0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x740,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
  local_ddc = edition_unittest::TestAllTypes::optional_nested_enum
                        ((TestAllTypes *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<edition_unittest::TestAllTypes_NestedEnum,_edition_unittest::TestAllTypes_NestedEnum,_nullptr>
            ((EqHelper *)local_dd8,"TestAllTypes::BAZ","message.optional_nested_enum()",
             &edition_unittest::TestAllTypes::BAZ,&local_ddc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar1) {
    testing::Message::Message(&local_de8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x742,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_de8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  local_e08[1] = 6;
  local_e08[0] = edition_unittest::TestAllTypes::optional_foreign_enum
                           ((TestAllTypes *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::
  Compare<edition_unittest::ForeignEnum,_edition_unittest::ForeignEnum,_nullptr>
            ((EqHelper *)local_e00,"ForeignEnum<TestAllTypes>::FOREIGN_BAZ",
             "message.optional_foreign_enum()",local_e08 + 1,local_e08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar1) {
    testing::Message::Message(&local_e10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x744,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_e10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  local_e30[1] = 9;
  local_e30[0] = edition_unittest::TestAllTypes::optional_import_enum
                           ((TestAllTypes *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest_import::ImportEnum,_proto2_unittest_import::ImportEnum,_nullptr>
            ((EqHelper *)local_e28,"ImportEnum<TestAllTypes>::IMPORT_BAZ",
             "message.optional_import_enum()",local_e30 + 1,local_e30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e28);
  if (!bVar1) {
    testing::Message::Message(&local_e38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x746,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_e38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e28);
  rhs = edition_unittest::TestAllTypes::optional_bytes_cord
                  ((TestAllTypes *)
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
  testing::internal::EqHelper::Compare<char[20],_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_e50,"\"optional bytes cord\"","message.optional_bytes_cord()",
             (char (*) [20])"optional bytes cord",rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x748,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  local_e78[1] = 2;
  local_e78[0] = edition_unittest::TestAllTypes::repeated_int32_size
                           ((TestAllTypes *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e70,"2","message.repeated_int32_size()",local_e78 + 1,local_e78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(&local_e80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e70);
    testing::internal::AssertHelper::AssertHelper
              (&local_e88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x74c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e88,&local_e80);
    testing::internal::AssertHelper::~AssertHelper(&local_e88);
    testing::Message::~Message(&local_e80);
  }
  gtest_ar_26.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_26.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  if (gtest_ar_26.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_ea8[1] = 2;
    local_ea8[0] = edition_unittest::TestAllTypes::repeated_int64_size
                             ((TestAllTypes *)
                              gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_ea0,"2","message.repeated_int64_size()",local_ea8 + 1,local_ea8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
    if (!bVar1) {
      testing::Message::Message(&local_eb0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ea0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_27.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0x74d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_eb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
      testing::Message::~Message(&local_eb0);
    }
    gtest_ar_26.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_26.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
    if (gtest_ar_26.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_ed0[1] = 2;
      local_ed0[0] = edition_unittest::TestAllTypes::repeated_uint32_size
                               ((TestAllTypes *)
                                gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_ec8,"2","message.repeated_uint32_size()",local_ed0 + 1,local_ed0)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
      if (!bVar1) {
        testing::Message::Message(&local_ed8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ec8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_28.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0x74e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_ed8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
        testing::Message::~Message(&local_ed8);
      }
      gtest_ar_26.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_26.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
      if (gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_ef8[1] = 2;
        local_ef8[0] = edition_unittest::TestAllTypes::repeated_uint64_size
                                 ((TestAllTypes *)
                                  gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_ef0,"2","message.repeated_uint64_size()",local_ef8 + 1,
                   local_ef8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef0);
        if (!bVar1) {
          testing::Message::Message(&local_f00);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ef0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_29.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0x74f,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_29.message_,&local_f00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
          testing::Message::~Message(&local_f00);
        }
        gtest_ar_26.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_26.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef0);
        if (gtest_ar_26.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_f20[1] = 2;
          local_f20[0] = edition_unittest::TestAllTypes::repeated_sint32_size
                                   ((TestAllTypes *)
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_f18,"2","message.repeated_sint32_size()",local_f20 + 1,
                     local_f20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f18);
          if (!bVar1) {
            testing::Message::Message(&local_f28);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f18);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_30.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0x750,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_30.message_,&local_f28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
            testing::Message::~Message(&local_f28);
          }
          gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f18);
          if (gtest_ar_26.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_f48[1] = 2;
            local_f48[0] = edition_unittest::TestAllTypes::repeated_sint64_size
                                     ((TestAllTypes *)
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_f40,"2","message.repeated_sint64_size()",local_f48 + 1,
                       local_f48);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f40);
            if (!bVar1) {
              testing::Message::Message(&local_f50);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f40);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_31.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0x751,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_31.message_,&local_f50);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
              testing::Message::~Message(&local_f50);
            }
            gtest_ar_26.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_26.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_f40);
            if (gtest_ar_26.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_f70[1] = 2;
              local_f70[0] = edition_unittest::TestAllTypes::repeated_fixed32_size
                                       ((TestAllTypes *)
                                        gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_f68,"2","message.repeated_fixed32_size()",local_f70 + 1,
                         local_f70);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f68);
              if (!bVar1) {
                testing::Message::Message(&local_f78);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f68);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_32.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0x752,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_32.message_,&local_f78);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_32.message_);
                testing::Message::~Message(&local_f78);
              }
              gtest_ar_26.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_26.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_f68);
              if (gtest_ar_26.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_f98[1] = 2;
                local_f98[0] = edition_unittest::TestAllTypes::repeated_fixed64_size
                                         ((TestAllTypes *)
                                          gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_f90,"2","message.repeated_fixed64_size()",local_f98 + 1
                           ,local_f98);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_f90);
                if (!bVar1) {
                  testing::Message::Message(&local_fa0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f90);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_33.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0x753,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_33.message_,&local_fa0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_33.message_);
                  testing::Message::~Message(&local_fa0);
                }
                gtest_ar_26.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_26.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_f90);
                if (gtest_ar_26.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_fc0[1] = 2;
                  local_fc0[0] = edition_unittest::TestAllTypes::repeated_sfixed32_size
                                           ((TestAllTypes *)
                                            gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_fb8,"2","message.repeated_sfixed32_size()",
                             local_fc0 + 1,local_fc0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_fb8);
                  if (!bVar1) {
                    testing::Message::Message(&local_fc8);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fb8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_34.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0x754,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_34.message_,&local_fc8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_34.message_);
                    testing::Message::~Message(&local_fc8);
                  }
                  gtest_ar_26.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_26.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fb8);
                  if (gtest_ar_26.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_fe8[1] = 2;
                    local_fe8[0] = edition_unittest::TestAllTypes::repeated_sfixed64_size
                                             ((TestAllTypes *)
                                              gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_fe0,"2","message.repeated_sfixed64_size()",
                               local_fe8 + 1,local_fe8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_fe0);
                    if (!bVar1) {
                      testing::Message::Message(&local_ff0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_fe0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_35.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0x755,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_35.message_,&local_ff0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_35.message_);
                      testing::Message::~Message(&local_ff0);
                    }
                    gtest_ar_26.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_26.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_fe0);
                    if (gtest_ar_26.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_1010[1] = 2;
                      local_1010[0] =
                           edition_unittest::TestAllTypes::repeated_float_size
                                     ((TestAllTypes *)
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_1008,"2","message.repeated_float_size()",
                                 local_1010 + 1,local_1010);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_1008);
                      if (!bVar1) {
                        testing::Message::Message(&local_1018);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_1008);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_36.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0x756,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_36.message_,&local_1018);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_36.message_);
                        testing::Message::~Message(&local_1018);
                      }
                      gtest_ar_26.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_26.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1008);
                      if (gtest_ar_26.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_1038[1] = 2;
                        local_1038[0] =
                             edition_unittest::TestAllTypes::repeated_double_size
                                       ((TestAllTypes *)
                                        gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_1030,"2","message.repeated_double_size()",
                                   local_1038 + 1,local_1038);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_1030);
                        if (!bVar1) {
                          testing::Message::Message(&local_1040);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_1030);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_37.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0x757,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_37.message_,&local_1040);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_37.message_);
                          testing::Message::~Message(&local_1040);
                        }
                        gtest_ar_26.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_26.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1030);
                        if (gtest_ar_26.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_1060[1] = 2;
                          local_1060[0] =
                               edition_unittest::TestAllTypes::repeated_bool_size
                                         ((TestAllTypes *)
                                          gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_1058,"2","message.repeated_bool_size()",
                                     local_1060 + 1,local_1060);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_1058);
                          if (!bVar1) {
                            testing::Message::Message(&local_1068);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_1058);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_38.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0x758,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_38.message_,&local_1068);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_38.message_);
                            testing::Message::~Message(&local_1068);
                          }
                          gtest_ar_26.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_26.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
                          if (gtest_ar_26.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_1088[1] = 2;
                            local_1088[0] =
                                 edition_unittest::TestAllTypes::repeated_string_size
                                           ((TestAllTypes *)
                                            gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_1080,"2","message.repeated_string_size()",
                                       local_1088 + 1,local_1088);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_1080);
                            if (!bVar1) {
                              testing::Message::Message(&local_1090);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_1080);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_39.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0x759,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_39.message_,&local_1090);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_39.message_);
                              testing::Message::~Message(&local_1090);
                            }
                            gtest_ar_26.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_26.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)local_1080);
                            if (gtest_ar_26.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_10b0[1] = 2;
                              local_10b0[0] =
                                   edition_unittest::TestAllTypes::repeated_bytes_size
                                             ((TestAllTypes *)
                                              gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_10a8,"2","message.repeated_bytes_size()",
                                         local_10b0 + 1,local_10b0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_10a8);
                              if (!bVar1) {
                                testing::Message::Message(&local_10b8);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_10a8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_40.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0x75a,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_40.message_,&local_10b8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_40.message_);
                                testing::Message::~Message(&local_10b8);
                              }
                              gtest_ar_26.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_26.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_10a8);
                              if (gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                local_10d8[1] = 2;
                                local_10d8[0] =
                                     edition_unittest::TestAllTypes::repeatedgroup_size
                                               ((TestAllTypes *)
                                                gtest_ar_.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl);
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_10d0,"2","message.repeatedgroup_size()"
                                           ,local_10d8 + 1,local_10d8);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_10d0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_10e0);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_10d0);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_41.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0x75c,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_41.message_,&local_10e0);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_41.message_);
                                  testing::Message::~Message(&local_10e0);
                                }
                                gtest_ar_26.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_26.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_10d0);
                                if (gtest_ar_26.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  local_1100[1] = 2;
                                  local_1100[0] =
                                       edition_unittest::TestAllTypes::repeated_nested_message_size
                                                 ((TestAllTypes *)
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_10f8,"2",
                                             "message.repeated_nested_message_size()",local_1100 + 1
                                             ,local_1100);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_10f8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_1108);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_10f8);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_42.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0x75d,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_42.message_,&local_1108);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_42.message_);
                                    testing::Message::~Message(&local_1108);
                                  }
                                  gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_10f8);
                                  if (gtest_ar_26.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    local_1128[1] = 2;
                                    local_1128[0] =
                                         edition_unittest::TestAllTypes::
                                         repeated_foreign_message_size
                                                   ((TestAllTypes *)
                                                    gtest_ar_.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_1120,"2",
                                               "message.repeated_foreign_message_size()",
                                               local_1128 + 1,local_1128);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_1120);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_1130);
                                      pcVar2 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_1120);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_43.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0x75e,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_43.message_,&local_1130);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_43.message_);
                                      testing::Message::~Message(&local_1130);
                                    }
                                    gtest_ar_26.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar_26.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_1120);
                                    if (gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      local_1150[1] = 2;
                                      local_1150[0] =
                                           edition_unittest::TestAllTypes::
                                           repeated_import_message_size
                                                     ((TestAllTypes *)
                                                      gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_1148,"2",
                                                 "message.repeated_import_message_size()",
                                                 local_1150 + 1,local_1150);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_1148);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_1158);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_1148);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_44.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x75f,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_44.message_,&local_1158
                                                  );
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_44.message_);
                                        testing::Message::~Message(&local_1158);
                                      }
                                      gtest_ar_26.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar_26.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_1148);
                                      if (gtest_ar_26.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        local_1178[1] = 2;
                                        local_1178[0] =
                                             edition_unittest::TestAllTypes::
                                             repeated_lazy_message_size
                                                       ((TestAllTypes *)
                                                        gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((EqHelper *)local_1170,"2",
                                                   "message.repeated_lazy_message_size()",
                                                   local_1178 + 1,local_1178);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_1170);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_1180);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_1170);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_45.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x760,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_45.message_,
                                                     &local_1180);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_45.message_);
                                          testing::Message::~Message(&local_1180);
                                        }
                                        gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_1170);
                                        if (gtest_ar_26.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          local_11a0[1] = 2;
                                          local_11a0[0] =
                                               edition_unittest::TestAllTypes::
                                               repeated_nested_enum_size
                                                         ((TestAllTypes *)
                                                          gtest_ar_.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                    ((EqHelper *)local_1198,"2",
                                                     "message.repeated_nested_enum_size()",
                                                     local_11a0 + 1,local_11a0);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_1198);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_11a8);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_1198);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_46.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x761,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_46.message_,
                                                       &local_11a8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_46.message_);
                                            testing::Message::~Message(&local_11a8);
                                          }
                                          gtest_ar_26.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._5_3_ = 0;
                                          gtest_ar_26.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_1198);
                                          if (gtest_ar_26.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_4_ == 0) {
                                            local_11c8[1] = 2;
                                            local_11c8[0] =
                                                 edition_unittest::TestAllTypes::
                                                 repeated_foreign_enum_size
                                                           ((TestAllTypes *)
                                                            gtest_ar_.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                      ((EqHelper *)local_11c0,"2",
                                                       "message.repeated_foreign_enum_size()",
                                                       local_11c8 + 1,local_11c8);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_11c0);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_11d0);
                                              pcVar2 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_11c0);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_47.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x762,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_47.message_,
                                                         &local_11d0);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar_47.message_);
                                              testing::Message::~Message(&local_11d0);
                                            }
                                            gtest_ar_26.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._5_3_ = 0;
                                            gtest_ar_26.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_11c0);
                                            if (gtest_ar_26.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_ == 0) {
                                              local_11f0[1] = 2;
                                              local_11f0[0] =
                                                   edition_unittest::TestAllTypes::
                                                   repeated_import_enum_size
                                                             ((TestAllTypes *)
                                                              gtest_ar_.message_._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                              testing::internal::EqHelper::
                                              Compare<int,_int,_nullptr>
                                                        ((EqHelper *)local_11e8,"2",
                                                         "message.repeated_import_enum_size()",
                                                         local_11f0 + 1,local_11f0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_11e8);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_11f8);
                                                pcVar2 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_11e8);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_48.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x763,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_48.message_,
                                                           &local_11f8);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_48.message_);
                                                testing::Message::~Message(&local_11f8);
                                              }
                                              gtest_ar_26.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._5_3_ = 0;
                                              gtest_ar_26.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_11e8);
                                              if (gtest_ar_26.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                local_1218[1] = 2;
                                                local_1218[0] =
                                                     edition_unittest::TestAllTypes::
                                                     repeated_string_piece_size
                                                               ((TestAllTypes *)
                                                                gtest_ar_.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1210,"2",
                                                           "message.repeated_string_piece_size()",
                                                           local_1218 + 1,local_1218);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1210);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1220);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1210)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x766,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             &local_1220);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_);
                                                  testing::Message::~Message(&local_1220);
                                                }
                                                gtest_ar_26.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._5_3_ = 0;
                                                gtest_ar_26.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1210);
                                                if (gtest_ar_26.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                  local_1240[1] = 2;
                                                  local_1240[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_cord_size((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1238,"2",
                                                             "message.repeated_cord_size()",
                                                             local_1240 + 1,local_1240);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1238);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1248);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1238);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_50.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x767,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_50.message_,
                                                             &local_1248);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_50.message_);
                                                  testing::Message::~Message(&local_1248);
                                                  }
                                                  gtest_ar_26.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_26.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1238);
                                                  if (gtest_ar_26.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    local_1264 = 0xc9;
                                                    local_1268 = edition_unittest::TestAllTypes::
                                                                 repeated_int32((TestAllTypes *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1260,"201",
                                                             "message.repeated_int32(0)",&local_1264
                                                             ,&local_1268);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1260);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1270);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1260);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_51.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_51.message_,
                                                             &local_1270);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_51.message_);
                                                  testing::Message::~Message(&local_1270);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1260);
                                                  local_128c = 0xca;
                                                  local_1298 = edition_unittest::TestAllTypes::
                                                               repeated_int64((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1288,"202",
                                                             "message.repeated_int64(0)",&local_128c
                                                             ,&local_1298);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1288);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_12a0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1288);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_52.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_52.message_,
                                                             &local_12a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_52.message_);
                                                  testing::Message::~Message(&local_12a0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1288);
                                                  local_12c0[1] = 0xcb;
                                                  local_12c0[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_uint32((TestAllTypes *)
                                                                       gtest_ar_.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_12b8,"203",
                                                             "message.repeated_uint32(0)",
                                                             (int *)(local_12c0 + 1),local_12c0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_12b8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_12c8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_12b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_53.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_53.message_,
                                                             &local_12c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_53.message_);
                                                  testing::Message::~Message(&local_12c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_12b8);
                                                  local_12e4 = 0xcc;
                                                  local_12f0 = edition_unittest::TestAllTypes::
                                                               repeated_uint64((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_12e0,"204",
                                                             "message.repeated_uint64(0)",
                                                             &local_12e4,&local_12f0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_12e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_12f8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_12e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_54.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_54.message_,
                                                             &local_12f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_54.message_);
                                                  testing::Message::~Message(&local_12f8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_12e0);
                                                  local_1314 = 0xcd;
                                                  local_1318 = edition_unittest::TestAllTypes::
                                                               repeated_sint32((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1310,"205",
                                                             "message.repeated_sint32(0)",
                                                             &local_1314,&local_1318);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1310);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1320);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1310);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_55.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_55.message_,
                                                             &local_1320);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_55.message_);
                                                  testing::Message::~Message(&local_1320);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1310);
                                                  local_133c = 0xce;
                                                  local_1348 = edition_unittest::TestAllTypes::
                                                               repeated_sint64((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1338,"206",
                                                             "message.repeated_sint64(0)",
                                                             &local_133c,&local_1348);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1338);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1350);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1338);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_56.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_56.message_,
                                                             &local_1350);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_56.message_);
                                                  testing::Message::~Message(&local_1350);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1338);
                                                  local_1370[1] = 0xcf;
                                                  local_1370[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_fixed32((TestAllTypes *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_1368,"207",
                                                             "message.repeated_fixed32(0)",
                                                             (int *)(local_1370 + 1),local_1370);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1368);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1378);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1368);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_57.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x770,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_57.message_,
                                                             &local_1378);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_57.message_);
                                                  testing::Message::~Message(&local_1378);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1368);
                                                  local_1394 = 0xd0;
                                                  local_13a0 = edition_unittest::TestAllTypes::
                                                               repeated_fixed64((TestAllTypes *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_1390,"208",
                                                             "message.repeated_fixed64(0)",
                                                             &local_1394,&local_13a0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1390);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_13a8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1390);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_58.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x771,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_58.message_,
                                                             &local_13a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_58.message_);
                                                  testing::Message::~Message(&local_13a8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1390);
                                                  local_13c4 = 0xd1;
                                                  local_13c8 = edition_unittest::TestAllTypes::
                                                               repeated_sfixed32((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_13c0,"209",
                                                             "message.repeated_sfixed32(0)",
                                                             &local_13c4,&local_13c8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_13c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_13d0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_13c0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_59.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x772,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_59.message_,
                                                             &local_13d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_59.message_);
                                                  testing::Message::~Message(&local_13d0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_13c0);
                                                  local_13ec = 0xd2;
                                                  local_13f8 = edition_unittest::TestAllTypes::
                                                               repeated_sfixed64((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_13e8,"210",
                                                             "message.repeated_sfixed64(0)",
                                                             &local_13ec,&local_13f8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_13e8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1400);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_13e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_60.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x773,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_60.message_,
                                                             &local_1400);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_60.message_);
                                                  testing::Message::~Message(&local_1400);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_13e8);
                                                  local_141c = 0xd3;
                                                  local_1420 = edition_unittest::TestAllTypes::
                                                               repeated_float((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_float,_nullptr>
                                                            ((EqHelper *)local_1418,"211",
                                                             "message.repeated_float(0)",&local_141c
                                                             ,&local_1420);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1418);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1428);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1418);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_61.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x774,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_61.message_,
                                                             &local_1428);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_61.message_);
                                                  testing::Message::~Message(&local_1428);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1418);
                                                  local_1444 = 0xd4;
                                                  local_1450 = edition_unittest::TestAllTypes::
                                                               repeated_double((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_double,_nullptr>
                                                            ((EqHelper *)local_1440,"212",
                                                             "message.repeated_double(0)",
                                                             &local_1444,&local_1450);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1440);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1458);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1440);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar__36.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x775,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__36.message_,
                                                             &local_1458);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__36.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1458);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1440);
                                                  local_1471 = edition_unittest::TestAllTypes::
                                                               repeated_bool((TestAllTypes *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1470,
                                                             &local_1471,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1470);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1480);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_62.message_,
                                                               (internal *)local_1470,
                                                               (AssertionResult *)
                                                               "message.repeated_bool(0)","false",
                                                               "true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1488,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x776,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1488,&local_1480);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1488);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_62.message_);
                                                  testing::Message::~Message(&local_1480);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1470);
                                                  local_14c8 = edition_unittest::TestAllTypes::
                                                               repeated_string((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_14b8,"\"215\"",
                                                             "message.repeated_string(0)",
                                                             (char (*) [4])"215",&local_14c8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_14b8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_14d0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_14b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_63.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x777,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_63.message_,
                                                             &local_14d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_63.message_);
                                                  testing::Message::~Message(&local_14d0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_14b8);
                                                  local_14f8 = edition_unittest::TestAllTypes::
                                                               repeated_bytes((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_14e8,"\"216\"",
                                                             "message.repeated_bytes(0)",
                                                             (char (*) [4])"216",&local_14f8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_14e8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1500);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_14e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_64.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x778,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_64.message_,
                                                             &local_1500);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_64.message_);
                                                  testing::Message::~Message(&local_1500);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_14e8);
                                                  local_151c = 0xd9;
                                                  pTVar8 = edition_unittest::TestAllTypes::
                                                           repeatedgroup((TestAllTypes *)
                                                                         gtest_ar_.message_._M_t.
                                                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  local_1520 = edition_unittest::
                                                               TestAllTypes_RepeatedGroup::a(pTVar8)
                                                  ;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1518,"217",
                                                             "message.repeatedgroup(0).a()",
                                                             &local_151c,&local_1520);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1518);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1528);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1518);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_65.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_65.message_,
                                                             &local_1528);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_65.message_);
                                                  testing::Message::~Message(&local_1528);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1518);
                                                  local_1544 = 0xda;
                                                  pTVar4 = edition_unittest::TestAllTypes::
                                                           repeated_nested_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  local_1548 = edition_unittest::
                                                               TestAllTypes_NestedMessage::bb
                                                                         (pTVar4);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1540,"218",
                                                                                                                          
                                                  "message.repeated_nested_message(0).bb()",
                                                  &local_1544,&local_1548);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1540);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1550);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1540);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_66.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_66.message_,
                                                             &local_1550);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_66.message_);
                                                  testing::Message::~Message(&local_1550);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1540);
                                                  local_1570[1] = 0xdb;
                                                  pvVar9 = (void *)0x0;
                                                  pFVar5 = edition_unittest::TestAllTypes::
                                                           repeated_foreign_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  local_1570[0] =
                                                       edition_unittest::ForeignMessage::c
                                                                 (pFVar5,pvVar9,extraout_RDX_00);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1568,"219",
                                                                                                                          
                                                  "message.repeated_foreign_message(0).c()",
                                                  local_1570 + 1,local_1570);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1568);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1578);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1568);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_67.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_67.message_,
                                                             &local_1578);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_67.message_);
                                                  testing::Message::~Message(&local_1578);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1568);
                                                  local_1594 = 0xdc;
                                                  pIVar6 = edition_unittest::TestAllTypes::
                                                           repeated_import_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  local_1598 = proto2_unittest_import::ImportMessage
                                                               ::d(pIVar6);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1590,"220",
                                                                                                                          
                                                  "message.repeated_import_message(0).d()",
                                                  &local_1594,&local_1598);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1590);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_15a0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1590);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_68.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_68.message_,
                                                             &local_15a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_68.message_);
                                                  testing::Message::~Message(&local_15a0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1590);
                                                  local_15bc = 0xe3;
                                                  pTVar4 = edition_unittest::TestAllTypes::
                                                           repeated_lazy_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  local_15c0 = edition_unittest::
                                                               TestAllTypes_NestedMessage::bb
                                                                         (pTVar4);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_15b8,"227",
                                                             "message.repeated_lazy_message(0).bb()"
                                                             ,&local_15bc,&local_15c0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_15b8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_15c8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_15b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_69.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_69.message_,
                                                             &local_15c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_69.message_);
                                                  testing::Message::~Message(&local_15c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15b8);
                                                  local_15e4 = edition_unittest::TestAllTypes::
                                                               repeated_nested_enum
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<edition_unittest::TestAllTypes_NestedEnum,_edition_unittest::TestAllTypes_NestedEnum,_nullptr>
                                                            ((EqHelper *)local_15e0,
                                                             "TestAllTypes::BAR",
                                                             "message.repeated_nested_enum(0)",
                                                             &edition_unittest::TestAllTypes::BAR,
                                                             &local_15e4);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_15e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_15f0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_15e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_70.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x781,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_70.message_,
                                                             &local_15f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_70.message_);
                                                  testing::Message::~Message(&local_15f0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15e0);
                                                  local_1610[1] = 5;
                                                  local_1610[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_foreign_enum
                                                                 ((TestAllTypes *)
                                                                  gtest_ar_.message_._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<edition_unittest::ForeignEnum,_edition_unittest::ForeignEnum,_nullptr>
                                                            ((EqHelper *)local_1608,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_BAR",
                                                  "message.repeated_foreign_enum(0)",local_1610 + 1,
                                                  local_1610);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1608);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1618);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1608);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_71.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x783,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_71.message_,
                                                             &local_1618);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_71.message_);
                                                  testing::Message::~Message(&local_1618);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1608);
                                                  local_1638[1] = 8;
                                                  local_1638[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_import_enum
                                                                 ((TestAllTypes *)
                                                                  gtest_ar_.message_._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                  testing::internal::EqHelper::
                                                  Compare<proto2_unittest_import::ImportEnum,_proto2_unittest_import::ImportEnum,_nullptr>
                                                            ((EqHelper *)local_1630,
                                                             "ImportEnum<TestAllTypes>::IMPORT_BAR",
                                                             "message.repeated_import_enum(0)",
                                                             local_1638 + 1,local_1638);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1630);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1640);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1630);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_72.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x785,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_72.message_,
                                                             &local_1640);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_72.message_);
                                                  testing::Message::~Message(&local_1640);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1630);
                                                  local_165c = 0x12d;
                                                  local_1660 = edition_unittest::TestAllTypes::
                                                               repeated_int32((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1658,"301",
                                                             "message.repeated_int32(1)",&local_165c
                                                             ,&local_1660);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1658);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1668);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1658);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_73.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x787,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_73.message_,
                                                             &local_1668);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_73.message_);
                                                  testing::Message::~Message(&local_1668);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1658);
                                                  local_1684 = 0x12e;
                                                  local_1690 = edition_unittest::TestAllTypes::
                                                               repeated_int64((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1680,"302",
                                                             "message.repeated_int64(1)",&local_1684
                                                             ,&local_1690);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1680);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1698);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1680);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_74.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x788,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_74.message_,
                                                             &local_1698);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_74.message_);
                                                  testing::Message::~Message(&local_1698);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1680);
                                                  local_16b8[1] = 0x12f;
                                                  local_16b8[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_uint32((TestAllTypes *)
                                                                       gtest_ar_.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_16b0,"303",
                                                             "message.repeated_uint32(1)",
                                                             (int *)(local_16b8 + 1),local_16b8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_16b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_16c0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_16b0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_75.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x789,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_75.message_,
                                                             &local_16c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_75.message_);
                                                  testing::Message::~Message(&local_16c0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_16b0);
                                                  local_16dc = 0x130;
                                                  local_16e8 = edition_unittest::TestAllTypes::
                                                               repeated_uint64((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_16d8,"304",
                                                             "message.repeated_uint64(1)",
                                                             &local_16dc,&local_16e8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_16d8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_16f0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_16d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_76.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_76.message_,
                                                             &local_16f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_76.message_);
                                                  testing::Message::~Message(&local_16f0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_16d8);
                                                  local_170c = 0x131;
                                                  local_1710 = edition_unittest::TestAllTypes::
                                                               repeated_sint32((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1708,"305",
                                                             "message.repeated_sint32(1)",
                                                             &local_170c,&local_1710);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1708);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1718);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1708);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_77.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_77.message_,
                                                             &local_1718);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_77.message_);
                                                  testing::Message::~Message(&local_1718);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1708);
                                                  local_1734 = 0x132;
                                                  local_1740 = edition_unittest::TestAllTypes::
                                                               repeated_sint64((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1730,"306",
                                                             "message.repeated_sint64(1)",
                                                             &local_1734,&local_1740);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1730);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1748);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1730);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_78.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_78.message_,
                                                             &local_1748);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_78.message_);
                                                  testing::Message::~Message(&local_1748);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1730);
                                                  local_1768[1] = 0x133;
                                                  local_1768[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_fixed32((TestAllTypes *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_1760,"307",
                                                             "message.repeated_fixed32(1)",
                                                             (int *)(local_1768 + 1),local_1768);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1760);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1770);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1760);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_79.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_79.message_,
                                                             &local_1770);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_79.message_);
                                                  testing::Message::~Message(&local_1770);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1760);
                                                  local_178c = 0x134;
                                                  local_1798 = edition_unittest::TestAllTypes::
                                                               repeated_fixed64((TestAllTypes *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_1788,"308",
                                                             "message.repeated_fixed64(1)",
                                                             &local_178c,&local_1798);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1788);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_17a0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1788);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_80.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_80.message_,
                                                             &local_17a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_80.message_);
                                                  testing::Message::~Message(&local_17a0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1788);
                                                  local_17bc = 0x135;
                                                  local_17c0 = edition_unittest::TestAllTypes::
                                                               repeated_sfixed32((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_17b8,"309",
                                                             "message.repeated_sfixed32(1)",
                                                             &local_17bc,&local_17c0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_17b8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_17c8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_17b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_81.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_81.message_,
                                                             &local_17c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_81.message_);
                                                  testing::Message::~Message(&local_17c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_17b8);
                                                  local_17e4 = 0x136;
                                                  local_17f0 = edition_unittest::TestAllTypes::
                                                               repeated_sfixed64((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_17e0,"310",
                                                             "message.repeated_sfixed64(1)",
                                                             &local_17e4,&local_17f0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_17e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_17f8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_17e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_82.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x790,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_82.message_,
                                                             &local_17f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_82.message_);
                                                  testing::Message::~Message(&local_17f8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_17e0);
                                                  local_1814 = 0x137;
                                                  local_1818 = edition_unittest::TestAllTypes::
                                                               repeated_float((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_float,_nullptr>
                                                            ((EqHelper *)local_1810,"311",
                                                             "message.repeated_float(1)",&local_1814
                                                             ,&local_1818);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1810);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1820);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1810);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_83.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x791,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_83.message_,
                                                             &local_1820);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_83.message_);
                                                  testing::Message::~Message(&local_1820);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1810);
                                                  local_183c = 0x138;
                                                  local_1848 = edition_unittest::TestAllTypes::
                                                               repeated_double((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_double,_nullptr>
                                                            ((EqHelper *)local_1838,"312",
                                                             "message.repeated_double(1)",
                                                             &local_183c,&local_1848);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1838);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1850);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1838);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar__37.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x792,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__37.message_,
                                                             &local_1850);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__37.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1850);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1838);
                                                  bVar1 = edition_unittest::TestAllTypes::
                                                          repeated_bool((TestAllTypes *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  local_1869 = (bool)((bVar1 ^ 0xffU) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1868,
                                                             &local_1869,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1868);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1878);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_84.message_,
                                                               (internal *)local_1868,
                                                               (AssertionResult *)
                                                               "message.repeated_bool(1)","true",
                                                               "false",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1880,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x793,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1880,&local_1878);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1880);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_84.message_);
                                                  testing::Message::~Message(&local_1878);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1868);
                                                  local_18c0 = edition_unittest::TestAllTypes::
                                                               repeated_string((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_18b0,"\"315\"",
                                                             "message.repeated_string(1)",
                                                             (char (*) [4])"315",&local_18c0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_18b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_18c8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_18b0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_85.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x794,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_85.message_,
                                                             &local_18c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_85.message_);
                                                  testing::Message::~Message(&local_18c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_18b0);
                                                  local_18f0 = edition_unittest::TestAllTypes::
                                                               repeated_bytes((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_18e0,"\"316\"",
                                                             "message.repeated_bytes(1)",
                                                             (char (*) [4])"316",&local_18f0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_18e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_18f8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_18e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_86.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x795,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_86.message_,
                                                             &local_18f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_86.message_);
                                                  testing::Message::~Message(&local_18f8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_18e0);
                                                  local_1914 = 0x13d;
                                                  pTVar8 = edition_unittest::TestAllTypes::
                                                           repeatedgroup((TestAllTypes *)
                                                                         gtest_ar_.message_._M_t.
                                                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  local_1918 = edition_unittest::
                                                               TestAllTypes_RepeatedGroup::a(pTVar8)
                                                  ;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1910,"317",
                                                             "message.repeatedgroup(1).a()",
                                                             &local_1914,&local_1918);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1910);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1920);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1910);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_87.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x797,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_87.message_,
                                                             &local_1920);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_87.message_);
                                                  testing::Message::~Message(&local_1920);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1910);
                                                  local_193c = 0x13e;
                                                  pTVar4 = edition_unittest::TestAllTypes::
                                                           repeated_nested_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  local_1940 = edition_unittest::
                                                               TestAllTypes_NestedMessage::bb
                                                                         (pTVar4);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1938,"318",
                                                                                                                          
                                                  "message.repeated_nested_message(1).bb()",
                                                  &local_193c,&local_1940);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1938);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1948);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1938);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_88.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x798,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_88.message_,
                                                             &local_1948);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_88.message_);
                                                  testing::Message::~Message(&local_1948);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1938);
                                                  local_1968[1] = 0x13f;
                                                  pvVar9 = (void *)0x1;
                                                  pFVar5 = edition_unittest::TestAllTypes::
                                                           repeated_foreign_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  local_1968[0] =
                                                       edition_unittest::ForeignMessage::c
                                                                 (pFVar5,pvVar9,extraout_RDX_01);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1960,"319",
                                                                                                                          
                                                  "message.repeated_foreign_message(1).c()",
                                                  local_1968 + 1,local_1968);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1960);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1970);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1960);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_89.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x799,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_89.message_,
                                                             &local_1970);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_89.message_);
                                                  testing::Message::~Message(&local_1970);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1960);
                                                  local_198c = 0x140;
                                                  pIVar6 = edition_unittest::TestAllTypes::
                                                           repeated_import_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  local_1990 = proto2_unittest_import::ImportMessage
                                                               ::d(pIVar6);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1988,"320",
                                                                                                                          
                                                  "message.repeated_import_message(1).d()",
                                                  &local_198c,&local_1990);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1988);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1998);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1988);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_90.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_90.message_,
                                                             &local_1998);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_90.message_);
                                                  testing::Message::~Message(&local_1998);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1988);
                                                  local_19b4 = 0x147;
                                                  pTVar4 = edition_unittest::TestAllTypes::
                                                           repeated_lazy_message
                                                                     ((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  local_19b8 = edition_unittest::
                                                               TestAllTypes_NestedMessage::bb
                                                                         (pTVar4);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_19b0,"327",
                                                             "message.repeated_lazy_message(1).bb()"
                                                             ,&local_19b4,&local_19b8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_19b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_19c0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_19b0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_91.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_91.message_,
                                                             &local_19c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_91.message_);
                                                  testing::Message::~Message(&local_19c0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_19b0);
                                                  local_19dc = edition_unittest::TestAllTypes::
                                                               repeated_nested_enum
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<edition_unittest::TestAllTypes_NestedEnum,_edition_unittest::TestAllTypes_NestedEnum,_nullptr>
                                                            ((EqHelper *)local_19d8,
                                                             "TestAllTypes::BAZ",
                                                             "message.repeated_nested_enum(1)",
                                                             &edition_unittest::TestAllTypes::BAZ,
                                                             &local_19dc);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_19d8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_19e8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_19d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_92.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_92.message_,
                                                             &local_19e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_92.message_);
                                                  testing::Message::~Message(&local_19e8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_19d8);
                                                  local_1a08[1] = 6;
                                                  local_1a08[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_foreign_enum
                                                                 ((TestAllTypes *)
                                                                  gtest_ar_.message_._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<edition_unittest::ForeignEnum,_edition_unittest::ForeignEnum,_nullptr>
                                                            ((EqHelper *)local_1a00,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_BAZ",
                                                  "message.repeated_foreign_enum(1)",local_1a08 + 1,
                                                  local_1a08);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1a00);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1a10);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1a00);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_93.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_93.message_,
                                                             &local_1a10);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_93.message_);
                                                  testing::Message::~Message(&local_1a10);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1a00);
                                                  local_1a30[1] = 9;
                                                  local_1a30[0] =
                                                       edition_unittest::TestAllTypes::
                                                       repeated_import_enum
                                                                 ((TestAllTypes *)
                                                                  gtest_ar_.message_._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                  testing::internal::EqHelper::
                                                  Compare<proto2_unittest_import::ImportEnum,_proto2_unittest_import::ImportEnum,_nullptr>
                                                            ((EqHelper *)local_1a28,
                                                             "ImportEnum<TestAllTypes>::IMPORT_BAZ",
                                                             "message.repeated_import_enum(1)",
                                                             local_1a30 + 1,local_1a30);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1a28);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1a38);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1a28);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar__38.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__38.message_,
                                                             &local_1a38);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__38.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1a38);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1a28);
                                                  local_1a51 = edition_unittest::TestAllTypes::
                                                               has_default_int32((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1a50,
                                                             &local_1a51,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1a50);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1a60);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__39.message_,
                                                               (internal *)local_1a50,
                                                               (AssertionResult *)
                                                               "message.has_default_int32()","false"
                                                               ,"true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1a68,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1a68,&local_1a60);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1a68);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__39.message_);
                                                  testing::Message::~Message(&local_1a60);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1a50);
                                                  local_1a99 = edition_unittest::TestAllTypes::
                                                               has_default_int64((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1a98,
                                                             &local_1a99,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1a98);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1aa8);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__40.message_,
                                                               (internal *)local_1a98,
                                                               (AssertionResult *)
                                                               "message.has_default_int64()","false"
                                                               ,"true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1ab0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1ab0,&local_1aa8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1ab0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__40.message_);
                                                  testing::Message::~Message(&local_1aa8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1a98);
                                                  local_1ae1 = edition_unittest::TestAllTypes::
                                                               has_default_uint32((TestAllTypes *)
                                                                                  gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1ae0,
                                                             &local_1ae1,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1ae0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1af0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__41.message_,
                                                               (internal *)local_1ae0,
                                                               (AssertionResult *)
                                                               "message.has_default_uint32()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1af8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a8,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1af8,&local_1af0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1af8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__41.message_);
                                                  testing::Message::~Message(&local_1af0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1ae0);
                                                  local_1b29 = edition_unittest::TestAllTypes::
                                                               has_default_uint64((TestAllTypes *)
                                                                                  gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1b28,
                                                             &local_1b29,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1b28);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1b38);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__42.message_,
                                                               (internal *)local_1b28,
                                                               (AssertionResult *)
                                                               "message.has_default_uint64()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1b40,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a9,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1b40,&local_1b38);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1b40);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__42.message_);
                                                  testing::Message::~Message(&local_1b38);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1b28);
                                                  local_1b71 = edition_unittest::TestAllTypes::
                                                               has_default_sint32((TestAllTypes *)
                                                                                  gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1b70,
                                                             &local_1b71,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1b70);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1b80);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__43.message_,
                                                               (internal *)local_1b70,
                                                               (AssertionResult *)
                                                               "message.has_default_sint32()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1b88,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7aa,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1b88,&local_1b80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1b88);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__43.message_);
                                                  testing::Message::~Message(&local_1b80);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1b70);
                                                  local_1bb9 = edition_unittest::TestAllTypes::
                                                               has_default_sint64((TestAllTypes *)
                                                                                  gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1bb8,
                                                             &local_1bb9,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1bb8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1bc8);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__44.message_,
                                                               (internal *)local_1bb8,
                                                               (AssertionResult *)
                                                               "message.has_default_sint64()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1bd0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ab,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1bd0,&local_1bc8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1bd0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__44.message_);
                                                  testing::Message::~Message(&local_1bc8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1bb8);
                                                  local_1c01 = edition_unittest::TestAllTypes::
                                                               has_default_fixed32((TestAllTypes *)
                                                                                   gtest_ar_.
                                                                                   message_._M_t.
                                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1c00,
                                                             &local_1c01,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1c00);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1c10);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__45.message_,
                                                               (internal *)local_1c00,
                                                               (AssertionResult *)
                                                               "message.has_default_fixed32()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1c18,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ac,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1c18,&local_1c10);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1c18);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__45.message_);
                                                  testing::Message::~Message(&local_1c10);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1c00);
                                                  local_1c49 = edition_unittest::TestAllTypes::
                                                               has_default_fixed64((TestAllTypes *)
                                                                                   gtest_ar_.
                                                                                   message_._M_t.
                                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1c48,
                                                             &local_1c49,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1c48);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1c58);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__46.message_,
                                                               (internal *)local_1c48,
                                                               (AssertionResult *)
                                                               "message.has_default_fixed64()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1c60,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ad,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1c60,&local_1c58);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1c60);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__46.message_);
                                                  testing::Message::~Message(&local_1c58);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1c48);
                                                  local_1c91 = edition_unittest::TestAllTypes::
                                                               has_default_sfixed32
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1c90,
                                                             &local_1c91,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1c90);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1ca0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__47.message_,
                                                               (internal *)local_1c90,
                                                               (AssertionResult *)
                                                               "message.has_default_sfixed32()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1ca8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ae,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1ca8,&local_1ca0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1ca8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__47.message_);
                                                  testing::Message::~Message(&local_1ca0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1c90);
                                                  local_1cd9 = edition_unittest::TestAllTypes::
                                                               has_default_sfixed64
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1cd8,
                                                             &local_1cd9,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1cd8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1ce8);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__48.message_,
                                                               (internal *)local_1cd8,
                                                               (AssertionResult *)
                                                               "message.has_default_sfixed64()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1cf0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7af,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1cf0,&local_1ce8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1cf0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__48.message_);
                                                  testing::Message::~Message(&local_1ce8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1cd8);
                                                  local_1d21 = edition_unittest::TestAllTypes::
                                                               has_default_float((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1d20,
                                                             &local_1d21,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1d20);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1d30);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__49.message_,
                                                               (internal *)local_1d20,
                                                               (AssertionResult *)
                                                               "message.has_default_float()","false"
                                                               ,"true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1d38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b0,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1d38,&local_1d30);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1d38);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__49.message_);
                                                  testing::Message::~Message(&local_1d30);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1d20);
                                                  local_1d69 = edition_unittest::TestAllTypes::
                                                               has_default_double((TestAllTypes *)
                                                                                  gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1d68,
                                                             &local_1d69,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1d68);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1d78);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__50.message_,
                                                               (internal *)local_1d68,
                                                               (AssertionResult *)
                                                               "message.has_default_double()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1d80,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1d80,&local_1d78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1d80);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__50.message_);
                                                  testing::Message::~Message(&local_1d78);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1d68);
                                                  local_1db1 = edition_unittest::TestAllTypes::
                                                               has_default_bool((TestAllTypes *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1db0,
                                                             &local_1db1,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1db0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1dc0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__51.message_,
                                                               (internal *)local_1db0,
                                                               (AssertionResult *)
                                                               "message.has_default_bool()","false",
                                                               "true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1dc8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b2,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1dc8,&local_1dc0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1dc8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__51.message_);
                                                  testing::Message::~Message(&local_1dc0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1db0);
                                                  local_1df9 = edition_unittest::TestAllTypes::
                                                               has_default_string((TestAllTypes *)
                                                                                  gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1df8,
                                                             &local_1df9,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1df8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1e08);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__52.message_,
                                                               (internal *)local_1df8,
                                                               (AssertionResult *)
                                                               "message.has_default_string()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1e10,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1e10,&local_1e08);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1e10);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__52.message_);
                                                  testing::Message::~Message(&local_1e08);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1df8);
                                                  local_1e41 = edition_unittest::TestAllTypes::
                                                               has_default_bytes((TestAllTypes *)
                                                                                 gtest_ar_.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1e40,
                                                             &local_1e41,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1e40);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1e50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__53.message_,
                                                               (internal *)local_1e40,
                                                               (AssertionResult *)
                                                               "message.has_default_bytes()","false"
                                                               ,"true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1e58,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b4,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1e58,&local_1e50);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1e58);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__53.message_);
                                                  testing::Message::~Message(&local_1e50);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1e40);
                                                  local_1e89 = edition_unittest::TestAllTypes::
                                                               has_default_nested_enum
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1e88,
                                                             &local_1e89,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1e88);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1e98);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__54.message_,
                                                               (internal *)local_1e88,
                                                               (AssertionResult *)
                                                               "message.has_default_nested_enum()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1ea0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1ea0,&local_1e98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1ea0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__54.message_);
                                                  testing::Message::~Message(&local_1e98);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1e88);
                                                  local_1ed1 = edition_unittest::TestAllTypes::
                                                               has_default_foreign_enum
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1ed0,
                                                             &local_1ed1,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1ed0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1ee0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__55.message_,
                                                               (internal *)local_1ed0,
                                                               (AssertionResult *)
                                                               "message.has_default_foreign_enum()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1ee8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1ee8,&local_1ee0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1ee8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__55.message_);
                                                  testing::Message::~Message(&local_1ee0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1ed0);
                                                  local_1f19 = edition_unittest::TestAllTypes::
                                                               has_default_import_enum
                                                                         ((TestAllTypes *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_1f18,
                                                             &local_1f19,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1f18);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1f28);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_94.message_,
                                                               (internal *)local_1f18,
                                                               (AssertionResult *)
                                                               "message.has_default_import_enum()",
                                                               "false","true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1f30,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b8,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1f30,&local_1f28);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1f30);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_94.message_);
                                                  testing::Message::~Message(&local_1f28);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1f18);
                                                  local_1f64 = 0x191;
                                                  local_1f68 = edition_unittest::TestAllTypes::
                                                               default_int32((TestAllTypes *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1f60,"401",
                                                             "message.default_int32()",&local_1f64,
                                                             &local_1f68);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1f60);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1f70);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1f60);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_95.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bb,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_95.message_,
                                                             &local_1f70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_95.message_);
                                                  testing::Message::~Message(&local_1f70);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1f60);
                                                  local_1f8c = 0x192;
                                                  local_1f98 = edition_unittest::TestAllTypes::
                                                               default_int64((TestAllTypes *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1f88,"402",
                                                             "message.default_int64()",&local_1f8c,
                                                             &local_1f98);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1f88);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1fa0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1f88);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_96.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bc,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_96.message_,
                                                             &local_1fa0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_96.message_);
                                                  testing::Message::~Message(&local_1fa0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1f88);
                                                  local_1fc0[1] = 0x193;
                                                  local_1fc0[0] =
                                                       edition_unittest::TestAllTypes::
                                                       default_uint32((TestAllTypes *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_1fb8,"403",
                                                             "message.default_uint32()",
                                                             (int *)(local_1fc0 + 1),local_1fc0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1fb8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1fc8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1fb8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_97.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bd,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_97.message_,
                                                             &local_1fc8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_97.message_);
                                                  testing::Message::~Message(&local_1fc8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1fb8);
                                                  local_1fe4 = 0x194;
                                                  local_1ff0 = edition_unittest::TestAllTypes::
                                                               default_uint64((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_1fe0,"404",
                                                             "message.default_uint64()",&local_1fe4,
                                                             &local_1ff0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1fe0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_1ff8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1fe0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_98.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7be,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_98.message_,
                                                             &local_1ff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_98.message_);
                                                  testing::Message::~Message(&local_1ff8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1fe0);
                                                  local_2014 = 0x195;
                                                  local_2018 = edition_unittest::TestAllTypes::
                                                               default_sint32((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_2010,"405",
                                                             "message.default_sint32()",&local_2014,
                                                             &local_2018);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2010);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2020);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2010);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_99.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bf,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_99.message_,
                                                             &local_2020);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_99.message_);
                                                  testing::Message::~Message(&local_2020);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2010);
                                                  local_203c = 0x196;
                                                  local_2048 = edition_unittest::TestAllTypes::
                                                               default_sint64((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_2038,"406",
                                                             "message.default_sint64()",&local_203c,
                                                             &local_2048);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2038);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2050);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2038);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_100.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c0,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_100.message_,
                                                             &local_2050);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_100.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2050);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2038);
                                                  local_2070[1] = 0x197;
                                                  local_2070[0] =
                                                       edition_unittest::TestAllTypes::
                                                       default_fixed32((TestAllTypes *)
                                                                       gtest_ar_.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_2068,"407",
                                                             "message.default_fixed32()",
                                                             (int *)(local_2070 + 1),local_2070);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2068);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2078);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2068);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_101.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_101.message_,
                                                             &local_2078);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_101.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2078);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2068);
                                                  local_2094 = 0x198;
                                                  local_20a0 = edition_unittest::TestAllTypes::
                                                               default_fixed64((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_2090,"408",
                                                             "message.default_fixed64()",&local_2094
                                                             ,&local_20a0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2090);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_20a8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2090);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_102.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c2,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_102.message_,
                                                             &local_20a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_102.message_)
                                                  ;
                                                  testing::Message::~Message(&local_20a8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2090);
                                                  local_20c4 = 0x199;
                                                  local_20c8 = edition_unittest::TestAllTypes::
                                                               default_sfixed32((TestAllTypes *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_20c0,"409",
                                                             "message.default_sfixed32()",
                                                             &local_20c4,&local_20c8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_20c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_20d0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_20c0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_103.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_103.message_,
                                                             &local_20d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_103.message_)
                                                  ;
                                                  testing::Message::~Message(&local_20d0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_20c0);
                                                  local_20ec = 0x19a;
                                                  local_20f8 = edition_unittest::TestAllTypes::
                                                               default_sfixed64((TestAllTypes *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_20e8,"410",
                                                             "message.default_sfixed64()",
                                                             &local_20ec,&local_20f8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_20e8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2100);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_20e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_104.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c4,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_104.message_,
                                                             &local_2100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_104.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2100);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_20e8);
                                                  local_211c = 0x19b;
                                                  local_2120 = edition_unittest::TestAllTypes::
                                                               default_float((TestAllTypes *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_float,_nullptr>
                                                            ((EqHelper *)local_2118,"411",
                                                             "message.default_float()",&local_211c,
                                                             &local_2120);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2118);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2128);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2118);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_105.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c5,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_105.message_,
                                                             &local_2128);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_105.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2128);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2118);
                                                  local_2144 = 0x19c;
                                                  local_2150 = edition_unittest::TestAllTypes::
                                                               default_double((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_double,_nullptr>
                                                            ((EqHelper *)local_2140,"412",
                                                             "message.default_double()",&local_2144,
                                                             &local_2150);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2140);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2158);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2140);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar__56.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__56.message_,
                                                             &local_2158);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__56.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2158);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2140);
                                                  bVar1 = edition_unittest::TestAllTypes::
                                                          default_bool((TestAllTypes *)
                                                                       gtest_ar_.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_2171 = (bool)((bVar1 ^ 0xffU) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_2170,
                                                             &local_2171,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2170);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2180);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_106.message_,
                                                               (internal *)local_2170,
                                                               (AssertionResult *)
                                                               "message.default_bool()","true",
                                                               "false",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_2188,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_2188,&local_2180);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_2188);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_106.message_);
                                                  testing::Message::~Message(&local_2180);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2170);
                                                  local_21c8 = edition_unittest::TestAllTypes::
                                                               default_string((TestAllTypes *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_21b8,"\"415\"",
                                                             "message.default_string()",
                                                             (char (*) [4])"415",&local_21c8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_21b8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_21d0);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_21b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_107.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c8,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_107.message_,
                                                             &local_21d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_107.message_)
                                                  ;
                                                  testing::Message::~Message(&local_21d0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_21b8);
                                                  local_21f8 = edition_unittest::TestAllTypes::
                                                               default_bytes((TestAllTypes *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_21e8,"\"416\"",
                                                             "message.default_bytes()",
                                                             (char (*) [4])0x1e0e5f2,&local_21f8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_21e8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2200);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_21e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_108.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c9,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_108.message_,
                                                             &local_2200);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_108.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2200);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_21e8);
                                                  local_221c = edition_unittest::TestAllTypes::
                                                               default_nested_enum((TestAllTypes *)
                                                                                   gtest_ar_.
                                                                                   message_._M_t.
                                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<edition_unittest::TestAllTypes_NestedEnum,_edition_unittest::TestAllTypes_NestedEnum,_nullptr>
                                                            ((EqHelper *)local_2218,
                                                             "TestAllTypes::FOO",
                                                             "message.default_nested_enum()",
                                                             &edition_unittest::TestAllTypes::FOO,
                                                             &local_221c);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2218);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2228);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2218);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_109.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7cb,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_109.message_,
                                                             &local_2228);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_109.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2228);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2218);
                                                  local_2248[1] = 4;
                                                  local_2248[0] =
                                                       edition_unittest::TestAllTypes::
                                                       default_foreign_enum
                                                                 ((TestAllTypes *)
                                                                  gtest_ar_.message_._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<edition_unittest::ForeignEnum,_edition_unittest::ForeignEnum,_nullptr>
                                                            ((EqHelper *)local_2240,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_FOO",
                                                  "message.default_foreign_enum()",local_2248 + 1,
                                                  local_2248);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2240);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2250);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2240);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar_110.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7cd,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_110.message_,
                                                             &local_2250);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_110.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2250);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2240);
                                                  local_2270[1] = 7;
                                                  local_2270[0] =
                                                       edition_unittest::TestAllTypes::
                                                       default_import_enum((TestAllTypes *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<proto2_unittest_import::ImportEnum,_proto2_unittest_import::ImportEnum,_nullptr>
                                                            ((EqHelper *)local_2268,
                                                             "ImportEnum<TestAllTypes>::IMPORT_FOO",
                                                             "message.default_import_enum()",
                                                             local_2270 + 1,local_2270);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2268);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2278);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_2268);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar__57.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,1999,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__57.message_,
                                                             &local_2278);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__57.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2278);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2268);
                                                  bVar1 = edition_unittest::TestAllTypes::
                                                          has_oneof_uint32((TestAllTypes *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_2291 = (bool)((bVar1 ^ 0xffU) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_2290,
                                                             &local_2291,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2290);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_22a0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__58.message_,
                                                               (internal *)local_2290,
                                                               (AssertionResult *)
                                                               "message.has_oneof_uint32()","true",
                                                               "false",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_22a8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d2,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_22a8,&local_22a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_22a8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__58.message_);
                                                  testing::Message::~Message(&local_22a0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2290);
                                                  bVar1 = edition_unittest::TestAllTypes::
                                                          has_oneof_nested_message
                                                                    ((TestAllTypes *)
                                                                     gtest_ar_.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_22d9 = (bool)((bVar1 ^ 0xffU) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_22d8,
                                                             &local_22d9,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_22d8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_22e8);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__59.message_,
                                                               (internal *)local_22d8,
                                                               (AssertionResult *)
                                                               "message.has_oneof_nested_message()",
                                                               "true","false",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_22f0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_22f0,&local_22e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_22f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__59.message_);
                                                  testing::Message::~Message(&local_22e8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_22d8);
                                                  bVar1 = edition_unittest::TestAllTypes::
                                                          has_oneof_string((TestAllTypes *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_2321 = (bool)((bVar1 ^ 0xffU) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_2320,
                                                             &local_2321,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2320);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2330);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__60.message_,
                                                               (internal *)local_2320,
                                                               (AssertionResult *)
                                                               "message.has_oneof_string()","true",
                                                               "false",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_2338,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d4,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_2338,&local_2330);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_2338);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__60.message_);
                                                  testing::Message::~Message(&local_2330);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2320);
                                                  local_2369 = edition_unittest::TestAllTypes::
                                                               has_oneof_bytes((TestAllTypes *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_2368,
                                                             &local_2369,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2368);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_2378);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_111.message_,
                                                               (internal *)local_2368,
                                                               (AssertionResult *)
                                                               "message.has_oneof_bytes()","false",
                                                               "true",in_R9);
                                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_2380,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d5,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_2380,&local_2378);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_2380);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_111.message_);
                                                  testing::Message::~Message(&local_2378);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2368);
                                                  local_23c0 = edition_unittest::TestAllTypes::
                                                               oneof_bytes((TestAllTypes *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                            ((EqHelper *)local_23b0,"\"604\"",
                                                             "message.oneof_bytes()",
                                                             (char (*) [4])"604",&local_23c0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_23b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_23c8);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_23b0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_23d0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_23d0,&local_23c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_23d0);
                                                  testing::Message::~Message(&local_23c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_23b0);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExpectAllFieldsSet(const TestAllTypes& message) {
  EXPECT_TRUE(message.has_optional_int32());
  EXPECT_TRUE(message.has_optional_int64());
  EXPECT_TRUE(message.has_optional_uint32());
  EXPECT_TRUE(message.has_optional_uint64());
  EXPECT_TRUE(message.has_optional_sint32());
  EXPECT_TRUE(message.has_optional_sint64());
  EXPECT_TRUE(message.has_optional_fixed32());
  EXPECT_TRUE(message.has_optional_fixed64());
  EXPECT_TRUE(message.has_optional_sfixed32());
  EXPECT_TRUE(message.has_optional_sfixed64());
  EXPECT_TRUE(message.has_optional_float());
  EXPECT_TRUE(message.has_optional_double());
  EXPECT_TRUE(message.has_optional_bool());
  EXPECT_TRUE(message.has_optional_string());
  EXPECT_TRUE(message.has_optional_bytes());

  EXPECT_TRUE(message.has_optionalgroup());
  EXPECT_TRUE(message.has_optional_nested_message());
  EXPECT_TRUE(message.has_optional_foreign_message());
  EXPECT_TRUE(message.has_optional_import_message());
  EXPECT_TRUE(message.has_optional_public_import_message());
  EXPECT_TRUE(message.has_optional_lazy_message());
  EXPECT_TRUE(message.has_optional_unverified_lazy_message());

  EXPECT_TRUE(message.optionalgroup().has_a());
  EXPECT_TRUE(message.optional_nested_message().has_bb());
  EXPECT_TRUE(message.optional_foreign_message().has_c());
  EXPECT_TRUE(message.optional_import_message().has_d());
  EXPECT_TRUE(message.optional_public_import_message().has_e());
  EXPECT_TRUE(message.optional_lazy_message().has_bb());
  EXPECT_TRUE(message.optional_unverified_lazy_message().has_bb());

  EXPECT_TRUE(message.has_optional_nested_enum());
  EXPECT_TRUE(message.has_optional_foreign_enum());
  EXPECT_TRUE(message.has_optional_import_enum());

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  EXPECT_TRUE(message.has_optional_string_piece());
  EXPECT_TRUE(message.has_optional_cord());
#endif
  EXPECT_TRUE(message.has_optional_bytes_cord());

  EXPECT_EQ(101, message.optional_int32());
  EXPECT_EQ(102, message.optional_int64());
  EXPECT_EQ(103, message.optional_uint32());
  EXPECT_EQ(104, message.optional_uint64());
  EXPECT_EQ(105, message.optional_sint32());
  EXPECT_EQ(106, message.optional_sint64());
  EXPECT_EQ(107, message.optional_fixed32());
  EXPECT_EQ(108, message.optional_fixed64());
  EXPECT_EQ(109, message.optional_sfixed32());
  EXPECT_EQ(110, message.optional_sfixed64());
  EXPECT_EQ(111, message.optional_float());
  EXPECT_EQ(112, message.optional_double());
  EXPECT_TRUE(message.optional_bool());
  EXPECT_EQ("115", message.optional_string());
  EXPECT_EQ("116", message.optional_bytes());

  EXPECT_EQ(117, message.optionalgroup().a());
  EXPECT_EQ(118, message.optional_nested_message().bb());
  EXPECT_EQ(119, message.optional_foreign_message().c());
  EXPECT_EQ(120, message.optional_import_message().d());
  EXPECT_EQ(126, message.optional_public_import_message().e());
  EXPECT_EQ(127, message.optional_lazy_message().bb());
  EXPECT_EQ(128, message.optional_unverified_lazy_message().bb());

  EXPECT_EQ(TestAllTypes::BAZ, message.optional_nested_enum());
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAZ,
            message.optional_foreign_enum());
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAZ,
            message.optional_import_enum());

  EXPECT_EQ("optional bytes cord", message.optional_bytes_cord());

  // -----------------------------------------------------------------

  ASSERT_EQ(2, message.repeated_int32_size());
  ASSERT_EQ(2, message.repeated_int64_size());
  ASSERT_EQ(2, message.repeated_uint32_size());
  ASSERT_EQ(2, message.repeated_uint64_size());
  ASSERT_EQ(2, message.repeated_sint32_size());
  ASSERT_EQ(2, message.repeated_sint64_size());
  ASSERT_EQ(2, message.repeated_fixed32_size());
  ASSERT_EQ(2, message.repeated_fixed64_size());
  ASSERT_EQ(2, message.repeated_sfixed32_size());
  ASSERT_EQ(2, message.repeated_sfixed64_size());
  ASSERT_EQ(2, message.repeated_float_size());
  ASSERT_EQ(2, message.repeated_double_size());
  ASSERT_EQ(2, message.repeated_bool_size());
  ASSERT_EQ(2, message.repeated_string_size());
  ASSERT_EQ(2, message.repeated_bytes_size());

  ASSERT_EQ(2, message.repeatedgroup_size());
  ASSERT_EQ(2, message.repeated_nested_message_size());
  ASSERT_EQ(2, message.repeated_foreign_message_size());
  ASSERT_EQ(2, message.repeated_import_message_size());
  ASSERT_EQ(2, message.repeated_lazy_message_size());
  ASSERT_EQ(2, message.repeated_nested_enum_size());
  ASSERT_EQ(2, message.repeated_foreign_enum_size());
  ASSERT_EQ(2, message.repeated_import_enum_size());

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  ASSERT_EQ(2, message.repeated_string_piece_size());
  ASSERT_EQ(2, message.repeated_cord_size());
#endif

  EXPECT_EQ(201, message.repeated_int32(0));
  EXPECT_EQ(202, message.repeated_int64(0));
  EXPECT_EQ(203, message.repeated_uint32(0));
  EXPECT_EQ(204, message.repeated_uint64(0));
  EXPECT_EQ(205, message.repeated_sint32(0));
  EXPECT_EQ(206, message.repeated_sint64(0));
  EXPECT_EQ(207, message.repeated_fixed32(0));
  EXPECT_EQ(208, message.repeated_fixed64(0));
  EXPECT_EQ(209, message.repeated_sfixed32(0));
  EXPECT_EQ(210, message.repeated_sfixed64(0));
  EXPECT_EQ(211, message.repeated_float(0));
  EXPECT_EQ(212, message.repeated_double(0));
  EXPECT_TRUE(message.repeated_bool(0));
  EXPECT_EQ("215", message.repeated_string(0));
  EXPECT_EQ("216", message.repeated_bytes(0));

  EXPECT_EQ(217, message.repeatedgroup(0).a());
  EXPECT_EQ(218, message.repeated_nested_message(0).bb());
  EXPECT_EQ(219, message.repeated_foreign_message(0).c());
  EXPECT_EQ(220, message.repeated_import_message(0).d());
  EXPECT_EQ(227, message.repeated_lazy_message(0).bb());


  EXPECT_EQ(TestAllTypes::BAR, message.repeated_nested_enum(0));
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAR,
            message.repeated_foreign_enum(0));
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAR,
            message.repeated_import_enum(0));

  EXPECT_EQ(301, message.repeated_int32(1));
  EXPECT_EQ(302, message.repeated_int64(1));
  EXPECT_EQ(303, message.repeated_uint32(1));
  EXPECT_EQ(304, message.repeated_uint64(1));
  EXPECT_EQ(305, message.repeated_sint32(1));
  EXPECT_EQ(306, message.repeated_sint64(1));
  EXPECT_EQ(307, message.repeated_fixed32(1));
  EXPECT_EQ(308, message.repeated_fixed64(1));
  EXPECT_EQ(309, message.repeated_sfixed32(1));
  EXPECT_EQ(310, message.repeated_sfixed64(1));
  EXPECT_EQ(311, message.repeated_float(1));
  EXPECT_EQ(312, message.repeated_double(1));
  EXPECT_FALSE(message.repeated_bool(1));
  EXPECT_EQ("315", message.repeated_string(1));
  EXPECT_EQ("316", message.repeated_bytes(1));

  EXPECT_EQ(317, message.repeatedgroup(1).a());
  EXPECT_EQ(318, message.repeated_nested_message(1).bb());
  EXPECT_EQ(319, message.repeated_foreign_message(1).c());
  EXPECT_EQ(320, message.repeated_import_message(1).d());
  EXPECT_EQ(327, message.repeated_lazy_message(1).bb());

  EXPECT_EQ(TestAllTypes::BAZ, message.repeated_nested_enum(1));
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAZ,
            message.repeated_foreign_enum(1));
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAZ,
            message.repeated_import_enum(1));


  // -----------------------------------------------------------------

  EXPECT_TRUE(message.has_default_int32());
  EXPECT_TRUE(message.has_default_int64());
  EXPECT_TRUE(message.has_default_uint32());
  EXPECT_TRUE(message.has_default_uint64());
  EXPECT_TRUE(message.has_default_sint32());
  EXPECT_TRUE(message.has_default_sint64());
  EXPECT_TRUE(message.has_default_fixed32());
  EXPECT_TRUE(message.has_default_fixed64());
  EXPECT_TRUE(message.has_default_sfixed32());
  EXPECT_TRUE(message.has_default_sfixed64());
  EXPECT_TRUE(message.has_default_float());
  EXPECT_TRUE(message.has_default_double());
  EXPECT_TRUE(message.has_default_bool());
  EXPECT_TRUE(message.has_default_string());
  EXPECT_TRUE(message.has_default_bytes());

  EXPECT_TRUE(message.has_default_nested_enum());
  EXPECT_TRUE(message.has_default_foreign_enum());
  EXPECT_TRUE(message.has_default_import_enum());


  EXPECT_EQ(401, message.default_int32());
  EXPECT_EQ(402, message.default_int64());
  EXPECT_EQ(403, message.default_uint32());
  EXPECT_EQ(404, message.default_uint64());
  EXPECT_EQ(405, message.default_sint32());
  EXPECT_EQ(406, message.default_sint64());
  EXPECT_EQ(407, message.default_fixed32());
  EXPECT_EQ(408, message.default_fixed64());
  EXPECT_EQ(409, message.default_sfixed32());
  EXPECT_EQ(410, message.default_sfixed64());
  EXPECT_EQ(411, message.default_float());
  EXPECT_EQ(412, message.default_double());
  EXPECT_FALSE(message.default_bool());
  EXPECT_EQ("415", message.default_string());
  EXPECT_EQ("416", message.default_bytes());

  EXPECT_EQ(TestAllTypes::FOO, message.default_nested_enum());
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_FOO,
            message.default_foreign_enum());
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_FOO,
            message.default_import_enum());


  EXPECT_FALSE(message.has_oneof_uint32());
  EXPECT_FALSE(message.has_oneof_nested_message());
  EXPECT_FALSE(message.has_oneof_string());
  EXPECT_TRUE(message.has_oneof_bytes());

  EXPECT_EQ("604", message.oneof_bytes());
}